

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void * stb_file(char *filename,size_t *length)

{
  FILE *__stream;
  size_t __n;
  void *__ptr;
  size_t sVar1;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (void *)0x0;
  }
  else {
    __n = stb_filelen((FILE *)__stream);
    __ptr = malloc(__n + 2);
    sVar1 = fread(__ptr,1,__n,__stream);
    if (sVar1 == __n) {
      if (length != (size_t *)0x0) {
        *length = __n;
      }
      *(undefined1 *)((long)__ptr + __n) = 0;
    }
    else {
      free(__ptr);
      __ptr = (void *)0x0;
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

void *stb_file(char *filename, size_t *length)
{
   FILE *f = stb__fopen(filename, "rb");
   char *buffer;
   size_t len, len2;
   if (!f) return NULL;
   len = stb_filelen(f);
   buffer = (char *) malloc(len+2); // nul + extra
   len2 = fread(buffer, 1, len, f);
   if (len2 == len) {
      if (length) *length = len;
      buffer[len] = 0;
   } else {
      free(buffer);
      buffer = NULL;
   }
   fclose(f);
   return buffer;
}